

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int64_t roaring_bitmap_get_index(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  uint16_t *puVar2;
  ushort x_00;
  uint8_t uVar3;
  int iVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  run_container_t *prVar10;
  long lVar11;
  long lVar12;
  
  x_00 = (ushort)x;
  iVar4 = (bm->high_low_container).size;
  uVar5 = (ulong)iVar4;
  if (uVar5 != 0) {
    puVar2 = (bm->high_low_container).keys;
    uVar6 = (ushort)(x >> 0x10);
    if (puVar2[uVar5 - 1] != uVar6) {
      if (iVar4 < 1) {
        return -1;
      }
      iVar9 = iVar4 + -1;
      uVar8 = 0;
      do {
        uVar7 = iVar9 + uVar8 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar9 + uVar8 & 0xfffffffe));
        if (uVar1 < uVar6) {
          uVar8 = uVar7 + 1;
        }
        else {
          if (uVar1 <= uVar6) goto LAB_0010a842;
          iVar9 = uVar7 - 1;
        }
      } while ((int)uVar8 <= iVar9);
      uVar7 = ~uVar8;
      goto LAB_0010a83a;
    }
  }
  uVar7 = iVar4 - 1;
LAB_0010a83a:
  if (-1 < (int)uVar7) {
LAB_0010a842:
    if (iVar4 < 1) {
      return 0;
    }
    lVar11 = 0;
    lVar12 = 0;
    while (uVar8 = (uint)(bm->high_low_container).keys[lVar11], uVar8 < x >> 0x10) {
      prVar10 = (run_container_t *)(bm->high_low_container).containers[lVar11];
      uVar3 = (bm->high_low_container).typecodes[lVar11];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&prVar10->runs;
        prVar10 = *(run_container_t **)prVar10;
      }
      if (uVar3 == '\x03') {
        iVar4 = run_container_cardinality(prVar10);
        uVar5 = (ulong)(uint)(bm->high_low_container).size;
      }
      else {
        iVar4 = prVar10->n_runs;
      }
      lVar12 = lVar12 + iVar4;
      lVar11 = lVar11 + 1;
      if ((int)uVar5 <= lVar11) {
        return lVar12;
      }
    }
    if (x >> 0x10 == uVar8) {
      prVar10 = (run_container_t *)(bm->high_low_container).containers[uVar7];
      uVar3 = (bm->high_low_container).typecodes[uVar7];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&prVar10->runs;
        prVar10 = *(run_container_t **)prVar10;
      }
      if (uVar3 == '\x03') {
        uVar7 = run_container_get_index(prVar10,x_00);
      }
      else if (uVar3 == '\x02') {
        if (prVar10->n_runs < 1) {
          return -1;
        }
        iVar4 = prVar10->n_runs + -1;
        uVar7 = 0;
        do {
          uVar8 = iVar4 + uVar7 >> 1;
          uVar6 = *(ushort *)((long)&prVar10->runs->value + (ulong)(iVar4 + uVar7 & 0xfffffffe));
          if (uVar6 < x_00) {
            uVar7 = uVar8 + 1;
          }
          else {
            if (uVar6 <= x_00) {
              return lVar12 + (ulong)uVar8;
            }
            iVar4 = uVar8 - 1;
          }
        } while ((int)uVar7 <= iVar4);
        uVar7 = ~((int)uVar7 >> 0x1f & uVar7);
      }
      else {
        uVar7 = bitset_container_get_index((bitset_container_t *)prVar10,x_00);
      }
      if (-1 < (int)uVar7) {
        return lVar12 + (ulong)uVar7;
      }
    }
  }
  return -1;
}

Assistant:

int64_t roaring_bitmap_get_index(const roaring_bitmap_t *bm, uint32_t x) {
    int64_t index = 0;
    const uint16_t xhigh = x >> 16;
    int32_t high_idx = ra_get_index(&bm->high_low_container, xhigh);
    if (high_idx < 0) return -1;

    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            index +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            int32_t low_idx = container_get_index(
                bm->high_low_container.containers[high_idx],
                bm->high_low_container.typecodes[high_idx], x & 0xFFFF);
            if (low_idx < 0) return -1;
            return index + low_idx;
        } else {
            return -1;
        }
    }
    return index;
}